

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void fmt::v6::detail::
     handle_int_type_spec<fmt::v6::detail::int_writer<std::back_insert_iterator<fmt::v6::detail::buffer<char>>,char,unsigned_long>&>
               (char spec,
               int_writer<std::back_insert_iterator<fmt::v6::detail::buffer<char>_>,_char,_unsigned_long>
               *handler)

{
  int iVar1;
  undefined7 in_register_00000039;
  
  iVar1 = (int)CONCAT71(in_register_00000039,spec);
  if (iVar1 < 99) {
    if (iVar1 < 0x4c) {
      if (iVar1 == 0) {
LAB_00109305:
        int_writer<std::back_insert_iterator<fmt::v6::detail::buffer<char>_>,_char,_unsigned_long>::
        on_dec(handler);
        return;
      }
      if (iVar1 == 0x42) {
LAB_001092f3:
        int_writer<std::back_insert_iterator<fmt::v6::detail::buffer<char>_>,_char,_unsigned_long>::
        on_bin(handler);
        return;
      }
    }
    else {
      if (iVar1 == 0x4c) {
LAB_0010930d:
        int_writer<std::back_insert_iterator<fmt::v6::detail::buffer<char>_>,_char,_unsigned_long>::
        on_num(handler);
        return;
      }
      if (iVar1 == 0x58) {
LAB_001092e2:
        int_writer<std::back_insert_iterator<fmt::v6::detail::buffer<char>_>,_char,_unsigned_long>::
        on_hex(handler);
        return;
      }
      if (iVar1 == 0x62) goto LAB_001092f3;
    }
  }
  else if (iVar1 < 0x6e) {
    if (iVar1 == 99) {
      int_writer<std::back_insert_iterator<fmt::v6::detail::buffer<char>_>,_char,_unsigned_long>::
      on_chr(handler);
      return;
    }
    if (iVar1 == 100) goto LAB_00109305;
  }
  else {
    if (iVar1 == 0x6e) goto LAB_0010930d;
    if (iVar1 == 0x6f) {
      int_writer<std::back_insert_iterator<fmt::v6::detail::buffer<char>_>,_char,_unsigned_long>::
      on_oct(handler);
      return;
    }
    if (iVar1 == 0x78) goto LAB_001092e2;
  }
  int_writer<std::back_insert_iterator<fmt::v6::detail::buffer<char>_>,_char,_unsigned_long>::
  on_error(handler);
}

Assistant:

FMT_CONSTEXPR void handle_int_type_spec(char spec, Handler&& handler) {
  switch (spec) {
  case 0:
  case 'd':
    handler.on_dec();
    break;
  case 'x':
  case 'X':
    handler.on_hex();
    break;
  case 'b':
  case 'B':
    handler.on_bin();
    break;
  case 'o':
    handler.on_oct();
    break;
  case 'n':
  case 'L':
    handler.on_num();
    break;
  case 'c':
    handler.on_chr();
    break;
  default:
    handler.on_error();
  }
}